

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TType::deepCopy(TType *this,TType *copyOf)

{
  TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
  copied;
  _Rb_tree<glslang::TVector<glslang::TTypeLoc>_*,_std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  local_50;
  
  local_50._M_impl.super__Node_allocator.allocator = GetThreadPoolAllocator();
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  deepCopy(this,copyOf,
           (TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
            *)&local_50);
  std::
  _Rb_tree<glslang::TVector<glslang::TTypeLoc>_*,_std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void deepCopy(const TType& copyOf)
    {
        TMap<TTypeList*,TTypeList*> copied;  // to enable copying a type graph as a graph, not a tree
        deepCopy(copyOf, copied);
    }